

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::PrintStats(LinearScan *this)

{
  IRKind IVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  BranchInstr *pBVar4;
  code *pcVar5;
  int iVar6;
  char cVar7;
  bool bVar8;
  OpndKind OVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  uint uVar13;
  BranchInstr *pBVar14;
  BranchInstr *this_00;
  byte bVar15;
  uint local_44;
  uint local_38;
  uint local_34;
  
  this_00 = (BranchInstr *)this->func->m_tailInstr;
  if (this_00 == (BranchInstr *)0x0) {
    bVar8 = true;
    uVar11 = 0;
    local_38 = 0;
    uVar10 = 0;
    local_34 = 0;
    local_44 = 0;
  }
  else {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar13 = 0;
    local_44 = 0;
    local_34 = 0;
    uVar10 = 0;
    bVar15 = 0;
    local_38 = 0;
    uVar11 = 0;
    pBVar14 = (BranchInstr *)0x0;
    do {
      if ((pBVar14 != (BranchInstr *)0x0) &&
         ((BranchInstr *)(pBVar14->super_Instr).m_prev != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1274,
                           "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar8) goto LAB_00588bea;
        *puVar12 = 0;
      }
      switch((this_00->super_Instr).m_kind) {
      case InstrKindBranch:
        bVar8 = IR::BranchInstr::IsLoopTail(this_00,this->func);
        uVar13 = uVar13 + bVar8;
        local_38 = local_38 + 1;
        break;
      case InstrKindLabel:
      case InstrKindProfiledLabel:
        if (((ulong)this_00[1].super_Instr._vptr_Instr & 1) != 0) {
          if (uVar13 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1288,"(loopNest)","loopNest");
            if (!bVar8) goto LAB_00588bea;
            *puVar12 = 0;
          }
          uVar13 = uVar13 - 1;
        }
        IVar1 = (this_00->super_Instr).m_kind;
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
          if (!bVar8) goto LAB_00588bea;
          *puVar12 = 0;
        }
        bVar15 = *(byte *)&this_00[1].super_Instr._vptr_Instr >> 1;
        break;
      default:
        bVar8 = IR::Instr::IsRealInstr(&this_00->super_Instr);
        if (!bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1291,"(instr->IsRealInstr())","instr->IsRealInstr()");
          if (!bVar8) goto LAB_00588bea;
          *puVar12 = 0;
        }
        if ((bVar15 & 1) == 0) {
          pOVar2 = (this_00->super_Instr).m_dst;
          cVar7 = (char)uVar13;
          if ((pOVar2 != (Opnd *)0x0) && (OVar9 = IR::Opnd::GetKind(pOVar2), OVar9 == OpndKindSym))
          {
            OVar9 = IR::Opnd::GetKind(pOVar2);
            if (OVar9 != OpndKindSym) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
              if (!bVar8) goto LAB_00588bea;
              *puVar12 = 0;
            }
            if (*(char *)((long)pOVar2[1]._vptr_Opnd + 0x14) == '\x01') {
              OVar9 = IR::Opnd::GetKind(pOVar2);
              if (OVar9 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar8) goto LAB_00588bea;
                *puVar12 = 0;
              }
              pp_Var3 = pOVar2[1]._vptr_Opnd;
              if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                   ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                if (!bVar8) goto LAB_00588bea;
                *puVar12 = 0;
              }
              if ((*(byte *)((long)pp_Var3 + 0x19) & 0x10) != 0) {
                local_44 = local_44 + 1;
                iVar6 = uVar13 * 0x8000 + -0x28000;
                if (uVar13 < 6) {
                  iVar6 = 1 << (cVar7 * '\x03' & 0x1fU);
                }
                uVar10 = uVar10 + iVar6;
              }
            }
          }
          pOVar2 = (this_00->super_Instr).m_src1;
          if (pOVar2 != (Opnd *)0x0) {
            OVar9 = IR::Opnd::GetKind(pOVar2);
            if (OVar9 == OpndKindSym) {
              OVar9 = IR::Opnd::GetKind(pOVar2);
              if (OVar9 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar8) goto LAB_00588bea;
                *puVar12 = 0;
              }
              if (*(char *)((long)pOVar2[1]._vptr_Opnd + 0x14) == '\x01') {
                OVar9 = IR::Opnd::GetKind(pOVar2);
                if (OVar9 != OpndKindSym) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                  if (!bVar8) goto LAB_00588bea;
                  *puVar12 = 0;
                }
                pp_Var3 = pOVar2[1]._vptr_Opnd;
                if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                     ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar8) goto LAB_00588bea;
                  *puVar12 = 0;
                }
                if ((*(byte *)((long)pp_Var3 + 0x19) & 0x10) != 0) {
                  local_34 = local_34 + 1;
                  iVar6 = uVar13 * 0x8000 + -0x28000;
                  if (uVar13 < 6) {
                    iVar6 = 1 << (cVar7 * '\x03' & 0x1fU);
                  }
                  uVar11 = uVar11 + iVar6;
                }
              }
            }
            pOVar2 = (this_00->super_Instr).m_src2;
            if ((pOVar2 != (Opnd *)0x0) && (OVar9 = IR::Opnd::GetKind(pOVar2), OVar9 == OpndKindSym)
               ) {
              OVar9 = IR::Opnd::GetKind(pOVar2);
              if (OVar9 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar8) goto LAB_00588bea;
                *puVar12 = 0;
              }
              if (*(char *)((long)pOVar2[1]._vptr_Opnd + 0x14) == '\x01') {
                OVar9 = IR::Opnd::GetKind(pOVar2);
                if (OVar9 != OpndKindSym) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                  if (!bVar8) goto LAB_00588bea;
                  *puVar12 = 0;
                }
                pp_Var3 = pOVar2[1]._vptr_Opnd;
                if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                     ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar8) goto LAB_00588bea;
                  *puVar12 = 0;
                }
                if ((*(byte *)((long)pp_Var3 + 0x19) & 0x10) != 0) {
                  local_34 = local_34 + 1;
                  iVar6 = uVar13 * 0x8000 + -0x28000;
                  if (uVar13 < 6) {
                    iVar6 = 1 << (cVar7 * '\x03' & 0x1fU);
                  }
                  uVar11 = uVar11 + iVar6;
                }
              }
            }
          }
        }
        break;
      case InstrKindPragma:
        break;
      }
      pBVar4 = (BranchInstr *)(this_00->super_Instr).m_prev;
      pBVar14 = this_00;
      this_00 = pBVar4;
    } while (pBVar4 != (BranchInstr *)0x0);
    bVar8 = uVar13 == 0;
  }
  if (!bVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x12b2,"(loopNest == 0)","loopNest == 0");
    if (!bVar8) {
LAB_00588bea:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  Func::DumpFullFunctionName(this->func);
  Output::SkipToColumn(0x2d);
  Output::Print(L"Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n",
                (ulong)local_38,(ulong)local_34,(ulong)local_44,(ulong)uVar11,(ulong)uVar10,
                uVar10 + uVar11);
  return;
}

Assistant:

void LinearScan::PrintStats() const
{
    uint loopNest = 0;
    uint storeCount = 0;
    uint loadCount = 0;
    uint wStoreCount = 0;
    uint wLoadCount = 0;
    uint instrCount = 0;
    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_BACKWARD(instr, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindPragma:
            continue;

        case IR::InstrKindBranch:
            if (instr->AsBranchInstr()->IsLoopTail(this->func))
            {
                loopNest++;
            }

            instrCount++;
            break;

        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                Assert(loopNest);
                loopNest--;
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;
            break;

        default:
            {
                Assert(instr->IsRealInstr());

                if (isInHelper)
                {
                    continue;
                }

                IR::Opnd *dst = instr->GetDst();
                if (dst && dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym() && dst->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                {
                    storeCount++;
                    wStoreCount += LinearScan::GetUseSpillCost(loopNest, false);
                }
                IR::Opnd *src1 = instr->GetSrc1();
                if (src1)
                {
                    if (src1->IsSymOpnd() && src1->AsSymOpnd()->m_sym->IsStackSym() && src1->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                    IR::Opnd *src2 = instr->GetSrc2();
                    if (src2 && src2->IsSymOpnd() && src2->AsSymOpnd()->m_sym->IsStackSym() && src2->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())
                    {
                        loadCount++;
                        wLoadCount += LinearScan::GetUseSpillCost(loopNest, false);
                    }
                }
            }
            break;
        }
    } NEXT_INSTR_IN_FUNC_BACKWARD;

    Assert(loopNest == 0);

    this->func->DumpFullFunctionName();
    Output::SkipToColumn(45);

    Output::Print(_u("Instrs:%5d, Lds:%4d, Strs:%4d, WLds: %4d, WStrs: %4d, WRefs: %4d\n"),
        instrCount, loadCount, storeCount, wLoadCount, wStoreCount, wLoadCount+wStoreCount);
}